

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcommon.cpp
# Opt level: O2

string * __thiscall message::to_string_abi_cxx11_(string *__return_storage_ptr__,message *this)

{
  ostream *poVar1;
  stringstream buffer;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Message with id ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," has contents ");
  poVar1 = std::operator<<(poVar1,"\'");
  poVar1 = std::operator<<(poVar1,(string *)&this->body_);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string message::to_string() {
    std::stringstream buffer;
    buffer << "Message with id " << id() << " has contents " << "'" << body() << "'";
    return buffer.str();
}